

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O2

void squall::detail::construct_object<std::function<void(Foo*)>>
               (HSQUIRRELVM vm,function<void_(Foo_*)> *v)

{
  undefined8 *puVar1;
  function<void_(Foo_*)> *this;
  
  puVar1 = (undefined8 *)sq_newuserdata(vm,8);
  this = (function<void_(Foo_*)> *)operator_new(0x20);
  std::function<void_(Foo_*)>::function(this,v);
  *puVar1 = this;
  sq_setreleasehook(vm,-1,construct_object<std::function<void_(Foo_*)>_>::anon_class_1_0_00000001::
                          __invoke);
  return;
}

Assistant:

void construct_object(HSQUIRRELVM vm, const T& v) {
    SQUserPointer p = sq_newuserdata(vm, sizeof(T*));
    *((T**)p) = new T(v);
    SQRELEASEHOOK hook = [](SQUserPointer p, SQInteger)->SQInteger {
        delete *((T**)p);
        return 0;
    };
    sq_setreleasehook(vm, -1, hook);
}